

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
hta::detail::
make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>::operator()
          (make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_const_char_*>
           *this,stringstream *msg,char *arg,path *args,char *args_1,char *args_2)

{
  ostream *__os;
  size_t sVar1;
  make_exception<const_char_*,_const_char_*> local_59;
  path local_58;
  
  __os = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)__os + (int)*(undefined8 *)(*(long *)__os + -0x18));
  }
  else {
    sVar1 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(__os,arg,sVar1);
  }
  Catch::clara::std::filesystem::__cxx11::path::path(&local_58,(path *)args);
  std::filesystem::__cxx11::operator<<(__os,(path *)&local_58);
  make_exception<const_char_*,_const_char_*>::operator()(&local_59,msg,args_1,args_2);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }